

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_navigationbar.cpp
# Opt level: O0

void QtMWidgets::NavigationBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  QMetaType QVar2;
  int *result;
  QMetaType local_38;
  QMetaType local_30;
  QObject *local_28;
  NavigationBar *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (NavigationBar *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    local_28 = _o;
    switch(_id) {
    case 0:
      currentChanged((NavigationBar *)_o,*_a[1]);
      break;
    case 1:
      showScreen((NavigationBar *)_o,*_a[1]);
      break;
    case 2:
      showPreviousScreen((NavigationBar *)_o);
      break;
    case 3:
      showNextScreen((NavigationBar *)_o);
    }
  }
  else if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 1) {
      if (*_a[1] == 0) {
        QVar2 = QMetaType::fromType<QWidget*>();
        **(undefined8 **)_t = QVar2.d_ptr;
      }
      else {
        memset(&local_38,0,8);
        QMetaType::QMetaType(&local_38);
        **(undefined8 **)_t = local_38.d_ptr;
      }
    }
    else {
      memset(&local_30,0,8);
      QMetaType::QMetaType(&local_30);
      **(undefined8 **)_t = local_30.d_ptr;
    }
  }
  else if ((_c == IndexOfMethod) &&
          (pcVar1 = *_a[1],
          pcVar1 == currentChanged && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0))) {
    *(undefined4 *)*_a = 0;
  }
  return;
}

Assistant:

void QtMWidgets::NavigationBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<NavigationBar *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->showScreen((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 2: _t->showPreviousScreen(); break;
        case 3: _t->showNextScreen(); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (NavigationBar::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&NavigationBar::currentChanged)) {
                *result = 0;
                return;
            }
        }
    }
}